

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DBSCAN.cpp
# Opt level: O2

void __thiscall DBSCAN::KeyEmbCluster(DBSCAN *this,uint emb_id,int clusterId)

{
  uint uVar1;
  pointer pEVar2;
  long lVar3;
  pointer pEVar4;
  unsigned_long i;
  ulong uVar5;
  
  pEVar2 = (this->embs).super__Vector_base<Embedding,_std::allocator<Embedding>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pEVar2[emb_id].is_key == true) {
    for (uVar5 = 0;
        lVar3 = *(long *)&pEVar2[emb_id].arrival_embs.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl,
        uVar5 < (ulong)((long)*(pointer *)
                               ((long)&pEVar2[emb_id].arrival_embs.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                               + 8) - lVar3 >> 2); uVar5 = uVar5 + 1) {
      uVar1 = *(uint *)(lVar3 + uVar5 * 4);
      pEVar4 = (this->embs).super__Vector_base<Embedding,_std::allocator<Embedding>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (pEVar4[uVar1].visited == false) {
        pEVar4 = pEVar4 + uVar1;
        pEVar4->cluster_id = clusterId;
        pEVar4->visited = true;
        if (pEVar4->is_key == true) {
          KeyEmbCluster(this,pEVar4->emb_id,clusterId);
        }
      }
    }
  }
  return;
}

Assistant:

void DBSCAN::KeyEmbCluster(unsigned int emb_id, int clusterId)
{
    Embedding& src_emb = this->embs[emb_id];        //获取数据点对象
    if(!src_emb.IsKey())
        return;
    std::vector<unsigned int>& arrval_embs = src_emb.GetArrivalEmbs();        //获取对象领域内点ID列表
    for(unsigned long i=0; i<arrval_embs.size(); i++)
    {
        Embedding& des_emb = this->embs[arrval_embs[i]];    //获取领域内点数据点
        if(!des_emb.IsVisited())                            //若该对象没有被访问过执行
        {
            //cout << "数据点\t"<< desDp.GetDpId()<<"聚类ID为\t" <<clusterId << endl;
            des_emb.SetClusterID(clusterId);        //设置该对象所属簇的ID为clusterId，即将该对象吸入簇中
            des_emb.SetVisited(true);                //设置该对象已被访问
            if(des_emb.IsKey())                    //若该对象是核心对象
            {
                KeyEmbCluster(des_emb.GetEmbID(),clusterId);    //递归地对该领域点数据的领域内的点执行聚类操作，采用深度优先方法
            }
        }
    }
}